

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbios_mgmt.c
# Opt level: O0

int vbios_upload_pramin(int cnum,uint8_t *vbios,int length)

{
  uint32_t uVar1;
  int local_2c;
  uint local_28;
  int local_24;
  uint32_t vbios_vram;
  int i;
  uint32_t old_bar0_pramin;
  int length_local;
  uint8_t *vbios_local;
  int cnum_local;
  
  vbios_vram = 0;
  if ((nva_cards[cnum]->chipset).chipset < 4) {
    vbios_local._4_4_ = -6;
  }
  else {
    fprintf(_stderr,"Attempt to upload the vbios to card %i (nv%02x) using PRAMIN\n",
            (ulong)(uint)cnum,(ulong)(uint)(nva_cards[cnum]->chipset).chipset);
    chksum(vbios,length);
    if (0x4f < (nva_cards[cnum]->chipset).card_type) {
      uVar1 = nva_rd32(cnum,0x619f04);
      local_28 = (uVar1 & 0xffffff00) << 8;
      if (local_28 == 0) {
        uVar1 = nva_rd32(cnum,0x1700);
        local_28 = uVar1 * 0x10000 + 0xf0000;
      }
      vbios_vram = nva_rd32(cnum,0x1700);
      nva_wr32(cnum,0x1700,local_28 >> 0x10);
    }
    local_2c = length;
    if (0xffff < length) {
      local_2c = 0x10000;
    }
    for (local_24 = 0; local_24 < local_2c; local_24 = local_24 + 1) {
      nva_wr8(cnum,local_24 + 0x700000,(uint)vbios[local_24]);
    }
    if (0x4f < (nva_cards[cnum]->chipset).card_type) {
      nva_wr32(cnum,0x1700,vbios_vram);
    }
    vbios_local._4_4_ = 1;
  }
  return vbios_local._4_4_;
}

Assistant:

int vbios_upload_pramin(int cnum, uint8_t *vbios, int length)
{
	uint32_t old_bar0_pramin = 0;
	int i = 0;

	if (nva_cards[cnum]->chipset.chipset < 0x04) {
		return ECARD;
	}

	fprintf(stderr, "Attempt to upload the vbios to card %i (nv%02x) using PRAMIN\n",
			cnum, nva_cards[cnum]->chipset.chipset);

	/* Update the checksum */
	chksum(vbios, length);

	if (nva_cards[cnum]->chipset.card_type >= 0x50) {
		uint32_t vbios_vram = (nva_rd32(cnum, 0x619f04) & ~0xff) << 8;

		if (!vbios_vram)
			vbios_vram = (nva_rd32(cnum, 0x1700) << 16) + 0xf0000;

		old_bar0_pramin = nva_rd32(cnum, 0x1700);
		nva_wr32(cnum, 0x1700, vbios_vram >> 16);
	}

	length = length < NV_PROM_SIZE ? length : NV_PROM_SIZE;

	for (i = 0; i < length; i++)
		nva_wr8(cnum, NV_PRAMIN_OFFSET + i, vbios[i]);

	if (nva_cards[cnum]->chipset.card_type >= 0x50)
		nva_wr32(cnum, 0x1700, old_bar0_pramin);

	return EOK;
}